

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O2

int hts_idx_get_stat(hts_idx_t *idx,int tid,uint64_t *mapped,uint64_t *unmapped)

{
  kh_bin_t *h;
  hts_pair64_t *phVar1;
  khint_t kVar2;
  int iVar3;
  uint64_t uVar4;
  
  if (idx->fmt != 3) {
    h = idx->bidx[tid];
    kVar2 = kh_get_bin(h,idx->n_bins + 1);
    if (kVar2 != h->n_buckets) {
      phVar1 = h->vals[kVar2].list;
      *mapped = phVar1[1].u;
      uVar4 = phVar1[1].v;
      iVar3 = 0;
      goto LAB_0010c813;
    }
  }
  *mapped = 0;
  iVar3 = -1;
  uVar4 = 0;
LAB_0010c813:
  *unmapped = uVar4;
  return iVar3;
}

Assistant:

int hts_idx_get_stat(const hts_idx_t* idx, int tid, uint64_t* mapped, uint64_t* unmapped)
{
    if ( idx->fmt == HTS_FMT_CRAI ) {
        *mapped = 0; *unmapped = 0;
        return -1;
    }

    bidx_t *h = idx->bidx[tid];
    khint_t k = kh_get(bin, h, META_BIN(idx));
    if (k != kh_end(h)) {
        *mapped = kh_val(h, k).list[1].u;
        *unmapped = kh_val(h, k).list[1].v;
        return 0;
    } else {
        *mapped = 0; *unmapped = 0;
        return -1;
    }
}